

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O3

void __thiscall gss::innards::Lackey::~Lackey(Lackey *this)

{
  ostream *poVar1;
  _Head_base<0UL,_gss::innards::Lackey::Imp_*,_false> __ptr;
  
  __ptr._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl;
  if ((*(byte *)((long)&(__ptr._M_head_impl)->field_0x48 +
                *(long *)(*(long *)&(__ptr._M_head_impl)->send_to + -0x18)) & 5) == 0) {
    poVar1 = (ostream *)&(__ptr._M_head_impl)->send_to;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Q 0",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    __ptr._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
         .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl;
    if (__ptr._M_head_impl == (Imp *)0x0) goto LAB_0013c2da;
  }
  std::default_delete<gss::innards::Lackey::Imp>::operator()
            ((default_delete<gss::innards::Lackey::Imp> *)this,__ptr._M_head_impl);
LAB_0013c2da:
  (this->_imp)._M_t.
  super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>.
  _M_t.
  super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
  .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl = (Imp *)0x0;
  return;
}

Assistant:

Lackey::~Lackey()
{
    if (_imp->send_to) {
        _imp->send_to << "Q 0" << endl;
    }
}